

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFrameBuffer.cpp
# Opt level: O2

Slice * __thiscall Imf_2_5::FrameBuffer::operator[](FrameBuffer *this,char *name)

{
  const_iterator cVar1;
  ostream *poVar2;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  ostream local_190 [376];
  
  Name::Name((Name *)&_iex_throw_s,name);
  cVar1 = std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
          ::find((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                  *)this,(key_type *)&_iex_throw_s);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->_map)._M_t._M_impl.super__Rb_tree_header) {
    return (Slice *)(cVar1._M_node + 9);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar2 = std::operator<<(local_190,"Cannot find frame buffer slice \"");
  poVar2 = std::operator<<(poVar2,name);
  std::operator<<(poVar2,"\".");
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

const Slice &
FrameBuffer::operator [] (const char name[]) const
{
    SliceMap::const_iterator i = _map.find (name);

    if (i == _map.end())
    {
        THROW (IEX_NAMESPACE::ArgExc,
               "Cannot find frame buffer slice \"" << name << "\".");
    }

    return i->second;
}